

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  char cVar28;
  byte bVar29;
  int iVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  char cVar34;
  char cVar35;
  char *pcVar36;
  char *pcVar37;
  long lVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  anon_struct_16_2_6ab6935c fields [22];
  char *local_1a0 [4];
  _GLFWmapelement *local_180;
  char *local_178;
  _GLFWmapelement *local_170;
  char *local_168;
  _GLFWmapelement *local_160;
  char *local_158;
  _GLFWmapelement *local_150;
  char *local_148;
  _GLFWmapelement *local_140;
  char *local_138;
  _GLFWmapelement *local_130;
  char *local_128;
  _GLFWmapelement *local_120;
  char *local_118;
  _GLFWmapelement *local_110;
  char *local_108;
  _GLFWmapelement *local_100;
  char *local_f8;
  _GLFWmapelement *local_f0;
  char *local_e8;
  _GLFWmapelement *local_e0;
  char *local_d8;
  _GLFWmapelement *local_d0;
  char *local_c8;
  _GLFWmapelement *local_c0;
  char *local_b8;
  _GLFWmapelement *local_b0;
  char *local_a8;
  _GLFWmapelement *local_a0;
  char *local_98;
  _GLFWmapelement *local_90;
  char *local_88;
  _GLFWmapelement *local_80;
  char *local_78;
  _GLFWmapelement *local_70;
  char *local_68;
  _GLFWmapelement *local_60;
  char *local_58;
  _GLFWmapelement *local_50;
  char *local_48;
  _GLFWmapelement *local_40;
  
  local_1a0[1] = "platform";
  local_1a0[2] = (char *)0x0;
  local_1a0[3] = "a";
  local_180 = mapping->buttons;
  local_178 = "b";
  local_170 = mapping->buttons + 1;
  local_168 = "x";
  local_160 = mapping->buttons + 2;
  local_158 = "y";
  local_150 = mapping->buttons + 3;
  local_148 = "back";
  local_140 = mapping->buttons + 6;
  local_138 = "start";
  local_130 = mapping->buttons + 7;
  local_128 = "guide";
  local_120 = mapping->buttons + 8;
  local_118 = "leftshoulder";
  local_110 = mapping->buttons + 4;
  local_108 = "rightshoulder";
  local_100 = mapping->buttons + 5;
  local_f8 = "leftstick";
  local_f0 = mapping->buttons + 9;
  local_e8 = "rightstick";
  local_e0 = mapping->buttons + 10;
  local_d8 = "dpup";
  local_d0 = mapping->buttons + 0xb;
  local_c8 = "dpright";
  local_c0 = mapping->buttons + 0xc;
  local_b8 = "dpdown";
  local_b0 = mapping->buttons + 0xd;
  local_a8 = "dpleft";
  local_a0 = mapping->buttons + 0xe;
  local_98 = "lefttrigger";
  local_70 = mapping->axes;
  local_90 = mapping->axes + 4;
  local_88 = "righttrigger";
  local_80 = mapping->axes + 5;
  local_78 = "leftx";
  local_68 = "lefty";
  local_60 = mapping->axes + 1;
  local_58 = "rightx";
  local_50 = mapping->axes + 2;
  local_48 = "righty";
  local_40 = mapping->axes + 3;
  local_1a0[0] = string;
  sVar31 = strcspn(string,",");
  if ((sVar31 == 0x20) && (string[0x20] == ',')) {
    uVar25 = *(undefined8 *)string;
    uVar26 = *(undefined8 *)(string + 8);
    uVar27 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar27;
    *(undefined8 *)mapping->guid = uVar25;
    *(undefined8 *)(mapping->guid + 8) = uVar26;
    pcVar37 = string + 0x21;
    sVar31 = strcspn(pcVar37,",");
    if ((sVar31 < 0x80) && (pcVar37[sVar31] == ',')) {
      pcVar1 = mapping->guid;
      memcpy(mapping,pcVar37,sVar31);
      pcVar37 = pcVar37 + sVar31 + 1;
      do {
        cVar28 = *pcVar37;
        local_1a0[0] = pcVar37;
        if (cVar28 == '\0') {
          lVar38 = 0;
          do {
            pcVar37 = pcVar1 + lVar38;
            bVar29 = pcVar37[1];
            bVar11 = pcVar37[2];
            bVar12 = pcVar37[3];
            bVar13 = pcVar37[4];
            bVar14 = pcVar37[5];
            bVar15 = pcVar37[6];
            bVar16 = pcVar37[7];
            bVar17 = pcVar37[8];
            bVar18 = pcVar37[9];
            bVar19 = pcVar37[10];
            bVar20 = pcVar37[0xb];
            bVar21 = pcVar37[0xc];
            bVar22 = pcVar37[0xd];
            bVar23 = pcVar37[0xe];
            bVar24 = pcVar37[0xf];
            bVar39 = *pcVar37 + 0xbf;
            bVar40 = bVar29 + 0xbf;
            bVar41 = bVar11 + 0xbf;
            bVar42 = bVar12 + 0xbf;
            bVar43 = bVar13 + 0xbf;
            bVar44 = bVar14 + 0xbf;
            bVar45 = bVar15 + 0xbf;
            bVar46 = bVar16 + 0xbf;
            bVar3 = (byte)((5 < bVar39) * '\x05' | (5 >= bVar39) * bVar39) == bVar39;
            bVar4 = (byte)((5 < bVar40) * '\x05' | (5 >= bVar40) * bVar40) == bVar40;
            bVar5 = (byte)((5 < bVar41) * '\x05' | (5 >= bVar41) * bVar41) == bVar41;
            bVar6 = (byte)((5 < bVar42) * '\x05' | (5 >= bVar42) * bVar42) == bVar42;
            bVar7 = (byte)((5 < bVar43) * '\x05' | (5 >= bVar43) * bVar43) == bVar43;
            bVar8 = (byte)((5 < bVar44) * '\x05' | (5 >= bVar44) * bVar44) == bVar44;
            bVar9 = (byte)((5 < bVar45) * '\x05' | (5 >= bVar45) * bVar45) == bVar45;
            bVar10 = (byte)((5 < bVar46) * '\x05' | (5 >= bVar46) * bVar46) == bVar46;
            if (bVar3) {
              pcVar1[lVar38] = *pcVar37 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar38 + 1] = bVar29 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar38 + 2] = bVar11 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar38 + 3] = bVar12 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar38 + 4] = bVar13 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar38 + 5] = bVar14 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar38 + 6] = bVar15 | 0x20;
            }
            if (bVar10) {
              mapping->guid[lVar38 + 7] = bVar16 | 0x20;
            }
            if (bVar3) {
              mapping->guid[lVar38 + 8] = bVar17 | 0x20;
            }
            if (bVar4) {
              mapping->guid[lVar38 + 9] = bVar18 | 0x20;
            }
            if (bVar5) {
              mapping->guid[lVar38 + 10] = bVar19 | 0x20;
            }
            if (bVar6) {
              mapping->guid[lVar38 + 0xb] = bVar20 | 0x20;
            }
            if (bVar7) {
              mapping->guid[lVar38 + 0xc] = bVar21 | 0x20;
            }
            if (bVar8) {
              mapping->guid[lVar38 + 0xd] = bVar22 | 0x20;
            }
            if (bVar9) {
              mapping->guid[lVar38 + 0xe] = bVar23 | 0x20;
            }
            if (bVar10) {
              mapping->guid[lVar38 + 0xf] = bVar24 | 0x20;
            }
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x20);
          (*_glfw.platform.updateGamepadGUID)(pcVar1);
          return 1;
        }
        if (cVar28 == '+') {
          return 0;
        }
        if (cVar28 == '-') {
          return 0;
        }
        lVar38 = 8;
        do {
          pcVar36 = *(char **)((long)local_1a0 + lVar38);
          sVar31 = strlen(pcVar36);
          iVar30 = strncmp(pcVar37,pcVar36,sVar31);
          if ((iVar30 == 0) && (pcVar37[sVar31] == ':')) {
            pcVar36 = pcVar37 + sVar31 + 1;
            pcVar2 = *(char **)((long)local_1a0 + lVar38 + 8);
            if (pcVar2 == (char *)0x0) {
              local_1a0[0] = pcVar36;
              pcVar37 = (*_glfw.platform.getMappingName)();
              sVar31 = strlen(pcVar37);
              iVar30 = strncmp(pcVar36,pcVar37,sVar31);
              pcVar37 = pcVar36;
              if (iVar30 != 0) {
                return 0;
              }
              break;
            }
            cVar28 = *pcVar36;
            cVar35 = '\x01';
            if (cVar28 == '+') {
              cVar34 = '\0';
              cVar35 = '\x01';
LAB_00141c1d:
              pcVar36 = pcVar37 + sVar31 + 2;
              cVar28 = pcVar37[sVar31 + 2];
            }
            else {
              if (cVar28 == '-') {
                cVar34 = -1;
                cVar35 = '\0';
                goto LAB_00141c1d;
              }
              cVar34 = -1;
            }
            local_1a0[0] = pcVar36;
            if (cVar28 == 'a') {
              cVar28 = '\x01';
LAB_00141c95:
              *pcVar2 = cVar28;
              uVar33 = strtoul(pcVar36 + 1,local_1a0,10);
              bVar29 = (byte)uVar33;
            }
            else {
              if (cVar28 != 'h') {
                pcVar37 = pcVar36;
                if (cVar28 == 'b') {
                  cVar28 = '\x02';
                  goto LAB_00141c95;
                }
                break;
              }
              *pcVar2 = '\x03';
              uVar33 = strtoul(pcVar36 + 1,local_1a0,10);
              uVar32 = strtoul(local_1a0[0] + 1,local_1a0,10);
              bVar29 = (byte)(uVar33 << 4) | (byte)uVar32;
            }
            pcVar2[1] = bVar29;
            pcVar37 = local_1a0[0];
            if (*pcVar2 == '\x01') {
              bVar29 = 2 / (byte)(cVar35 - cVar34);
              pcVar2[2] = bVar29;
              pcVar2[3] = -(cVar35 + cVar34);
              if (*local_1a0[0] == '~') {
                pcVar2[2] = -bVar29;
                pcVar2[3] = cVar35 + cVar34;
              }
            }
            break;
          }
          lVar38 = lVar38 + 0x10;
        } while (lVar38 != 0x168);
        sVar31 = strcspn(pcVar37,",");
        pcVar37 = pcVar37 + sVar31;
        local_1a0[0] = pcVar37;
        sVar31 = strspn(pcVar37,",");
        pcVar37 = pcVar37 + sVar31;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                const char* name = _glfw.platform.getMappingName();
                length = strlen(name);
                if (strncmp(c, name, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfw.platform.updateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}